

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_elements_address.cpp
# Opt level: O0

void __thiscall
ElementsAddressFactory_Constructor_type_prefix_Test::TestBody
          (ElementsAddressFactory_Constructor_type_prefix_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  WitnessVersion WVar6;
  char *pcVar7;
  CfdException *anon_var_0_2;
  bool gtest_caught_expected_2;
  ConstCharPtr gtest_msg_2;
  ElementsAddressFactory factory_9;
  CfdException *anon_var_0_1;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  ElementsAddressFactory factory_8;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  ElementsAddressFactory factory_7;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  Address address_1;
  ElementsAddressFactory factory_6;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Address address;
  ElementsAddressFactory factory_5;
  Pubkey pubkey;
  ElementsAddressFactory factory_4;
  ElementsAddressFactory factory_3;
  ElementsAddressFactory factory_2;
  ElementsAddressFactory factory_1;
  ElementsAddressFactory factory;
  undefined2 in_stack_fffffffffffff3e0;
  undefined1 in_stack_fffffffffffff3e2;
  undefined1 in_stack_fffffffffffff3e3;
  undefined1 in_stack_fffffffffffff3e4;
  undefined1 in_stack_fffffffffffff3e5;
  undefined1 in_stack_fffffffffffff3e6;
  undefined1 in_stack_fffffffffffff3e7;
  AddressFactory *in_stack_fffffffffffff3e8;
  undefined4 in_stack_fffffffffffff3f0;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffff3f4;
  char *in_stack_fffffffffffff3f8;
  AssertHelper local_bc8;
  Message local_bc0 [50];
  byte local_a29;
  ConstCharPtr local_a28 [9];
  AssertHelper local_9e0;
  Message local_9d8 [50];
  byte local_841;
  ConstCharPtr local_840 [9];
  AssertHelper local_7f8;
  Message local_7f0 [50];
  byte local_659;
  ConstCharPtr local_658 [9];
  AssertHelper local_610;
  Message local_608;
  undefined4 local_600;
  WitnessVersion local_5fc;
  AssertionResult local_5f8;
  AssertHelper local_5e8;
  Message local_5e0;
  undefined4 local_5d8;
  NetType local_5d4;
  AssertionResult local_5d0;
  Address local_5c0;
  AssertHelper local_400;
  Message local_3f8;
  undefined4 local_3f0;
  WitnessVersion local_3ec;
  AssertionResult local_3e8;
  AssertHelper local_3d8;
  Message local_3d0;
  undefined4 local_3c8;
  NetType local_3c4;
  AssertionResult local_3c0;
  Address local_3b0;
  allocator local_1e9;
  string local_1e8;
  Pubkey local_1c8;
  AssertHelper local_1b0;
  Message local_1a8 [9];
  AssertHelper local_160;
  Message local_158 [9];
  AssertHelper local_110;
  Message local_108 [9];
  AssertHelper local_c0;
  Message local_b8 [9];
  AssertHelper local_70;
  Message local_68 [13];
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::GetBitcoinAddressFormatList();
      cfd::ElementsAddressFactory::ElementsAddressFactory
                ((ElementsAddressFactory *)
                 CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                 (NetType)((ulong)in_stack_fffffffffffff3e8 >> 0x20),
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)CONCAT17(in_stack_fffffffffffff3e7,
                             CONCAT16(in_stack_fffffffffffff3e6,
                                      CONCAT15(in_stack_fffffffffffff3e5,
                                               CONCAT14(in_stack_fffffffffffff3e4,
                                                        CONCAT13(in_stack_fffffffffffff3e3,
                                                                 CONCAT12(in_stack_fffffffffffff3e2,
                                                                          in_stack_fffffffffffff3e0)
                                                                ))))));
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0));
      cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f4f77);
    }
  }
  else {
    testing::Message::Message(local_68);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x2b,
               "Expected: ElementsAddressFactory factory(NetType::kMainnet, GetBitcoinAddressFormatList()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::Message::~Message((Message *)0x1f503d);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::GetBitcoinAddressFormatList();
      cfd::ElementsAddressFactory::ElementsAddressFactory
                ((ElementsAddressFactory *)
                 CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                 (NetType)((ulong)in_stack_fffffffffffff3e8 >> 0x20),
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)CONCAT17(in_stack_fffffffffffff3e7,
                             CONCAT16(in_stack_fffffffffffff3e6,
                                      CONCAT15(in_stack_fffffffffffff3e5,
                                               CONCAT14(in_stack_fffffffffffff3e4,
                                                        CONCAT13(in_stack_fffffffffffff3e3,
                                                                 CONCAT12(in_stack_fffffffffffff3e2,
                                                                          in_stack_fffffffffffff3e0)
                                                                ))))));
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0));
      cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f50f3);
    }
  }
  else {
    testing::Message::Message(local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x2c,
               "Expected: ElementsAddressFactory factory(NetType::kTestnet, GetBitcoinAddressFormatList()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_c0,local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message((Message *)0x1f51b9);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::GetBitcoinAddressFormatList();
      cfd::ElementsAddressFactory::ElementsAddressFactory
                ((ElementsAddressFactory *)
                 CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                 (NetType)((ulong)in_stack_fffffffffffff3e8 >> 0x20),
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)CONCAT17(in_stack_fffffffffffff3e7,
                             CONCAT16(in_stack_fffffffffffff3e6,
                                      CONCAT15(in_stack_fffffffffffff3e5,
                                               CONCAT14(in_stack_fffffffffffff3e4,
                                                        CONCAT13(in_stack_fffffffffffff3e3,
                                                                 CONCAT12(in_stack_fffffffffffff3e2,
                                                                          in_stack_fffffffffffff3e0)
                                                                ))))));
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0));
      cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f526f);
    }
  }
  else {
    testing::Message::Message(local_108);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x2d,
               "Expected: ElementsAddressFactory factory(NetType::kRegtest, GetBitcoinAddressFormatList()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_110,local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message((Message *)0x1f5335);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::GetElementsAddressFormatList();
      cfd::ElementsAddressFactory::ElementsAddressFactory
                ((ElementsAddressFactory *)
                 CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                 (NetType)((ulong)in_stack_fffffffffffff3e8 >> 0x20),
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)CONCAT17(in_stack_fffffffffffff3e7,
                             CONCAT16(in_stack_fffffffffffff3e6,
                                      CONCAT15(in_stack_fffffffffffff3e5,
                                               CONCAT14(in_stack_fffffffffffff3e4,
                                                        CONCAT13(in_stack_fffffffffffff3e3,
                                                                 CONCAT12(in_stack_fffffffffffff3e2,
                                                                          in_stack_fffffffffffff3e0)
                                                                ))))));
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0));
      cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f53eb);
    }
  }
  else {
    testing::Message::Message(local_158);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x2e,
               "Expected: ElementsAddressFactory factory(NetType::kLiquidV1, GetElementsAddressFormatList()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_160,local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message((Message *)0x1f54b1);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::GetElementsAddressFormatList();
      cfd::ElementsAddressFactory::ElementsAddressFactory
                ((ElementsAddressFactory *)
                 CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                 (NetType)((ulong)in_stack_fffffffffffff3e8 >> 0x20),
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)CONCAT17(in_stack_fffffffffffff3e7,
                             CONCAT16(in_stack_fffffffffffff3e6,
                                      CONCAT15(in_stack_fffffffffffff3e5,
                                               CONCAT14(in_stack_fffffffffffff3e4,
                                                        CONCAT13(in_stack_fffffffffffff3e3,
                                                                 CONCAT12(in_stack_fffffffffffff3e2,
                                                                          in_stack_fffffffffffff3e0)
                                                                ))))));
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0));
      cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f5567);
    }
  }
  else {
    testing::Message::Message(local_1a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x2f,
               "Expected: ElementsAddressFactory factory(NetType::kElementsRegtest, GetElementsAddressFormatList()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1b0,local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    testing::Message::~Message((Message *)0x1f562d);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1e8,
             "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af",&local_1e9);
  cfd::core::Pubkey::Pubkey(&local_1c8,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  cfd::core::GetElementsAddressFormatList();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            ((ElementsAddressFactory *)CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0)
             ,(NetType)((ulong)in_stack_fffffffffffff3e8 >> 0x20),
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             CONCAT17(in_stack_fffffffffffff3e7,
                      CONCAT16(in_stack_fffffffffffff3e6,
                               CONCAT15(in_stack_fffffffffffff3e5,
                                        CONCAT14(in_stack_fffffffffffff3e4,
                                                 CONCAT13(in_stack_fffffffffffff3e3,
                                                          CONCAT12(in_stack_fffffffffffff3e2,
                                                                   in_stack_fffffffffffff3e0)))))));
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0));
  cfd::AddressFactory::CreateP2wpkhAddress
            (in_stack_fffffffffffff3e8,
             (Pubkey *)
             CONCAT17(in_stack_fffffffffffff3e7,
                      CONCAT16(in_stack_fffffffffffff3e6,
                               CONCAT15(in_stack_fffffffffffff3e5,
                                        CONCAT14(in_stack_fffffffffffff3e4,
                                                 CONCAT13(in_stack_fffffffffffff3e3,
                                                          CONCAT12(in_stack_fffffffffffff3e2,
                                                                   in_stack_fffffffffffff3e0)))))));
  local_3c4 = cfd::core::Address::GetNetType(&local_3b0);
  local_3c8 = 3;
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            (in_stack_fffffffffffff3f8,
             (char *)CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
             (NetType *)in_stack_fffffffffffff3e8,
             (NetType *)
             CONCAT17(in_stack_fffffffffffff3e7,
                      CONCAT16(in_stack_fffffffffffff3e6,
                               CONCAT15(in_stack_fffffffffffff3e5,
                                        CONCAT14(in_stack_fffffffffffff3e4,
                                                 CONCAT13(in_stack_fffffffffffff3e3,
                                                          CONCAT12(in_stack_fffffffffffff3e2,
                                                                   in_stack_fffffffffffff3e0)))))));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3c0);
  if (!bVar1) {
    testing::Message::Message(&local_3d0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x1f5897);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x35,pcVar7);
    testing::internal::AssertHelper::operator=(&local_3d8,&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    testing::Message::~Message((Message *)0x1f58f4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f594c);
  local_3ec = cfd::core::Address::GetWitnessVersion(&local_3b0);
  local_3f0 = 0;
  testing::internal::EqHelper<false>::Compare<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            (in_stack_fffffffffffff3f8,
             (char *)CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
             (WitnessVersion *)in_stack_fffffffffffff3e8,
             (WitnessVersion *)
             CONCAT17(in_stack_fffffffffffff3e7,
                      CONCAT16(in_stack_fffffffffffff3e6,
                               CONCAT15(in_stack_fffffffffffff3e5,
                                        CONCAT14(in_stack_fffffffffffff3e4,
                                                 CONCAT13(in_stack_fffffffffffff3e3,
                                                          CONCAT12(in_stack_fffffffffffff3e2,
                                                                   in_stack_fffffffffffff3e0)))))));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3e8);
  if (!bVar1) {
    testing::Message::Message(&local_3f8);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x1f5a0b);
    testing::internal::AssertHelper::AssertHelper
              (&local_400,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x36,pcVar7);
    testing::internal::AssertHelper::operator=(&local_400,&local_3f8);
    testing::internal::AssertHelper::~AssertHelper(&local_400);
    testing::Message::~Message((Message *)0x1f5a68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f5ac0);
  cfd::core::Address::~Address
            ((Address *)
             CONCAT17(in_stack_fffffffffffff3e7,
                      CONCAT16(in_stack_fffffffffffff3e6,
                               CONCAT15(in_stack_fffffffffffff3e5,
                                        CONCAT14(in_stack_fffffffffffff3e4,
                                                 CONCAT13(in_stack_fffffffffffff3e3,
                                                          CONCAT12(in_stack_fffffffffffff3e2,
                                                                   in_stack_fffffffffffff3e0)))))));
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f5ada);
  cfd::core::GetElementsAddressFormatList();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            ((ElementsAddressFactory *)CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0)
             ,(NetType)((ulong)in_stack_fffffffffffff3e8 >> 0x20),
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             CONCAT17(in_stack_fffffffffffff3e7,
                      CONCAT16(in_stack_fffffffffffff3e6,
                               CONCAT15(in_stack_fffffffffffff3e5,
                                        CONCAT14(in_stack_fffffffffffff3e4,
                                                 CONCAT13(in_stack_fffffffffffff3e3,
                                                          CONCAT12(in_stack_fffffffffffff3e2,
                                                                   in_stack_fffffffffffff3e0)))))));
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0));
  cfd::AddressFactory::CreateP2pkhAddress
            (in_stack_fffffffffffff3e8,
             (Pubkey *)
             CONCAT17(in_stack_fffffffffffff3e7,
                      CONCAT16(in_stack_fffffffffffff3e6,
                               CONCAT15(in_stack_fffffffffffff3e5,
                                        CONCAT14(in_stack_fffffffffffff3e4,
                                                 CONCAT13(in_stack_fffffffffffff3e3,
                                                          CONCAT12(in_stack_fffffffffffff3e2,
                                                                   in_stack_fffffffffffff3e0)))))));
  local_5d4 = cfd::core::Address::GetNetType(&local_5c0);
  local_5d8 = 4;
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            (in_stack_fffffffffffff3f8,
             (char *)CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
             (NetType *)in_stack_fffffffffffff3e8,
             (NetType *)
             CONCAT17(in_stack_fffffffffffff3e7,
                      CONCAT16(in_stack_fffffffffffff3e6,
                               CONCAT15(in_stack_fffffffffffff3e5,
                                        CONCAT14(in_stack_fffffffffffff3e4,
                                                 CONCAT13(in_stack_fffffffffffff3e3,
                                                          CONCAT12(in_stack_fffffffffffff3e2,
                                                                   in_stack_fffffffffffff3e0)))))));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5d0);
  if (!bVar1) {
    testing::Message::Message(&local_5e0);
    in_stack_fffffffffffff3f8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1f5c65);
    testing::internal::AssertHelper::AssertHelper
              (&local_5e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x3b,in_stack_fffffffffffff3f8);
    testing::internal::AssertHelper::operator=(&local_5e8,&local_5e0);
    testing::internal::AssertHelper::~AssertHelper(&local_5e8);
    testing::Message::~Message((Message *)0x1f5cc2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f5d1a);
  WVar6 = cfd::core::Address::GetWitnessVersion(&local_5c0);
  local_600 = 0xffffffff;
  local_5fc = WVar6;
  testing::internal::EqHelper<false>::Compare<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            (in_stack_fffffffffffff3f8,(char *)CONCAT44(WVar6,in_stack_fffffffffffff3f0),
             (WitnessVersion *)in_stack_fffffffffffff3e8,
             (WitnessVersion *)
             CONCAT17(in_stack_fffffffffffff3e7,
                      CONCAT16(in_stack_fffffffffffff3e6,
                               CONCAT15(in_stack_fffffffffffff3e5,
                                        CONCAT14(in_stack_fffffffffffff3e4,
                                                 CONCAT13(in_stack_fffffffffffff3e3,
                                                          CONCAT12(in_stack_fffffffffffff3e2,
                                                                   in_stack_fffffffffffff3e0)))))));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5f8);
  uVar8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff3f0);
  if (!bVar1) {
    testing::Message::Message(&local_608);
    in_stack_fffffffffffff3e8 =
         (AddressFactory *)testing::AssertionResult::failure_message((AssertionResult *)0x1f5dd9);
    testing::internal::AssertHelper::AssertHelper
              (&local_610,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x3c,(char *)in_stack_fffffffffffff3e8);
    testing::internal::AssertHelper::operator=(&local_610,&local_608);
    testing::internal::AssertHelper::~AssertHelper(&local_610);
    testing::Message::~Message((Message *)0x1f5e36);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f5e8e);
  cfd::core::Address::~Address
            ((Address *)
             CONCAT17(in_stack_fffffffffffff3e7,
                      CONCAT16(in_stack_fffffffffffff3e6,
                               CONCAT15(in_stack_fffffffffffff3e5,
                                        CONCAT14(in_stack_fffffffffffff3e4,
                                                 CONCAT13(in_stack_fffffffffffff3e3,
                                                          CONCAT12(in_stack_fffffffffffff3e2,
                                                                   in_stack_fffffffffffff3e0)))))));
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f5ea8);
  cfd::core::GetElementsAddressFormatList();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            ((ElementsAddressFactory *)CONCAT44(WVar6,uVar8),
             (NetType)((ulong)in_stack_fffffffffffff3e8 >> 0x20),
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             CONCAT17(in_stack_fffffffffffff3e7,
                      CONCAT16(in_stack_fffffffffffff3e6,
                               CONCAT15(in_stack_fffffffffffff3e5,
                                        CONCAT14(in_stack_fffffffffffff3e4,
                                                 CONCAT13(in_stack_fffffffffffff3e3,
                                                          CONCAT12(in_stack_fffffffffffff3e2,
                                                                   in_stack_fffffffffffff3e0)))))));
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             CONCAT44(WVar6,uVar8));
  testing::internal::ConstCharPtr::ConstCharPtr(local_658,"");
  uVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool(local_658);
  if ((bool)uVar2) {
    local_659 = 0;
    in_stack_fffffffffffff3e6 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffff3e6) {
      cfd::AddressFactory::CreateP2pkhAddress
                (in_stack_fffffffffffff3e8,
                 (Pubkey *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff3e6,
                                         CONCAT15(in_stack_fffffffffffff3e5,
                                                  CONCAT14(in_stack_fffffffffffff3e4,
                                                           CONCAT13(in_stack_fffffffffffff3e3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffff3e2,
                                                  in_stack_fffffffffffff3e0)))))));
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff3e6,
                                         CONCAT15(in_stack_fffffffffffff3e5,
                                                  CONCAT14(in_stack_fffffffffffff3e4,
                                                           CONCAT13(in_stack_fffffffffffff3e3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffff3e2,
                                                  in_stack_fffffffffffff3e0)))))));
    }
    if ((local_659 & 1) == 0) {
      local_658[0].value =
           "Expected: (factory.CreateP2pkhAddress(pubkey)) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_001f606d;
    }
  }
  else {
LAB_001f606d:
    testing::Message::Message(local_7f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x42,local_658[0].value);
    testing::internal::AssertHelper::operator=(&local_7f8,local_7f0);
    testing::internal::AssertHelper::~AssertHelper(&local_7f8);
    testing::Message::~Message((Message *)0x1f60d5);
  }
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f612d);
  cfd::core::GetElementsAddressFormatList();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            ((ElementsAddressFactory *)CONCAT44(WVar6,uVar8),
             (NetType)((ulong)in_stack_fffffffffffff3e8 >> 0x20),
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff3e6,
                                     CONCAT15(in_stack_fffffffffffff3e5,
                                              CONCAT14(in_stack_fffffffffffff3e4,
                                                       CONCAT13(in_stack_fffffffffffff3e3,
                                                                CONCAT12(in_stack_fffffffffffff3e2,
                                                                         in_stack_fffffffffffff3e0))
                                                      )))));
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             CONCAT44(WVar6,uVar8));
  testing::internal::ConstCharPtr::ConstCharPtr(local_840,"");
  uVar3 = testing::internal::ConstCharPtr::operator_cast_to_bool(local_840);
  if ((bool)uVar3) {
    local_841 = 0;
    in_stack_fffffffffffff3e4 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffff3e4) {
      cfd::AddressFactory::CreateP2pkhAddress
                (in_stack_fffffffffffff3e8,
                 (Pubkey *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff3e6,
                                         CONCAT15(uVar3,CONCAT14(in_stack_fffffffffffff3e4,
                                                                 CONCAT13(in_stack_fffffffffffff3e3,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffff3e2,
                                                  in_stack_fffffffffffff3e0)))))));
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff3e6,
                                         CONCAT15(uVar3,CONCAT14(in_stack_fffffffffffff3e4,
                                                                 CONCAT13(in_stack_fffffffffffff3e3,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffff3e2,
                                                  in_stack_fffffffffffff3e0)))))));
    }
    if ((local_841 & 1) == 0) {
      local_840[0].value =
           "Expected: (factory.CreateP2pkhAddress(pubkey)) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_001f62db;
    }
  }
  else {
LAB_001f62db:
    testing::Message::Message(local_9d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_9e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x46,local_840[0].value);
    testing::internal::AssertHelper::operator=(&local_9e0,local_9d8);
    testing::internal::AssertHelper::~AssertHelper(&local_9e0);
    testing::Message::~Message((Message *)0x1f6343);
  }
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f639b);
  cfd::core::GetElementsAddressFormatList();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            ((ElementsAddressFactory *)CONCAT44(WVar6,uVar8),
             (NetType)((ulong)in_stack_fffffffffffff3e8 >> 0x20),
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff3e6,
                                     CONCAT15(uVar3,CONCAT14(in_stack_fffffffffffff3e4,
                                                             CONCAT13(in_stack_fffffffffffff3e3,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffff3e2,
                                                  in_stack_fffffffffffff3e0)))))));
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             CONCAT44(WVar6,uVar8));
  testing::internal::ConstCharPtr::ConstCharPtr(local_a28,"");
  uVar4 = testing::internal::ConstCharPtr::operator_cast_to_bool(local_a28);
  if ((bool)uVar4) {
    local_a29 = 0;
    uVar5 = testing::internal::AlwaysTrue();
    if ((bool)uVar5) {
      cfd::AddressFactory::CreateP2pkhAddress
                (in_stack_fffffffffffff3e8,
                 (Pubkey *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff3e6,
                                         CONCAT15(uVar3,CONCAT14(in_stack_fffffffffffff3e4,
                                                                 CONCAT13(uVar4,CONCAT12(uVar5,
                                                  in_stack_fffffffffffff3e0)))))));
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff3e6,
                                         CONCAT15(uVar3,CONCAT14(in_stack_fffffffffffff3e4,
                                                                 CONCAT13(uVar4,CONCAT12(uVar5,
                                                  in_stack_fffffffffffff3e0)))))));
    }
    if ((local_a29 & 1) != 0) goto LAB_001f65d8;
    local_a28[0].value =
         "Expected: (factory.CreateP2pkhAddress(pubkey)) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_bc0);
  testing::internal::AssertHelper::AssertHelper
            (&local_bc8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
             ,0x4a,local_a28[0].value);
  testing::internal::AssertHelper::operator=(&local_bc8,local_bc0);
  testing::internal::AssertHelper::~AssertHelper(&local_bc8);
  testing::Message::~Message((Message *)0x1f6596);
LAB_001f65d8:
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f65e5);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x1f65f2);
  return;
}

Assistant:

TEST(ElementsAddressFactory, Constructor_type_prefix)
{
  EXPECT_NO_THROW(ElementsAddressFactory factory(NetType::kMainnet, GetBitcoinAddressFormatList()));
  EXPECT_NO_THROW(ElementsAddressFactory factory(NetType::kTestnet, GetBitcoinAddressFormatList()));
  EXPECT_NO_THROW(ElementsAddressFactory factory(NetType::kRegtest, GetBitcoinAddressFormatList()));
  EXPECT_NO_THROW(ElementsAddressFactory factory(NetType::kLiquidV1, GetElementsAddressFormatList()));
  EXPECT_NO_THROW(ElementsAddressFactory factory(NetType::kElementsRegtest, GetElementsAddressFormatList()));

  Pubkey pubkey = Pubkey("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  {
    ElementsAddressFactory factory(NetType::kLiquidV1, GetElementsAddressFormatList());
    Address address = factory.CreateP2wpkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kLiquidV1);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersion0);
  }
  {
    ElementsAddressFactory factory(NetType::kElementsRegtest, GetElementsAddressFormatList());
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kElementsRegtest);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }

  // error
  {
    ElementsAddressFactory factory(NetType::kMainnet, GetElementsAddressFormatList());
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
  {
    ElementsAddressFactory factory(NetType::kTestnet, GetElementsAddressFormatList());
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
  {
    ElementsAddressFactory factory(NetType::kRegtest, GetElementsAddressFormatList());
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
}